

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::QualifiedExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *d,Options *options)

{
  FileDescriptor *file;
  LogMessage *pLVar1;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  string local_70;
  LogFinisher local_31;
  
  field = d;
  if (this[0x43] == (cpp)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x16f);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)&local_70,"CHECK failed: d->is_extension(): ");
    google::protobuf::internal::LogFinisher::operator=(&local_31,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_70);
    field = extraout_RDX;
  }
  file = *(FileDescriptor **)(this + 0x28);
  FieldName_abi_cxx11_(&local_70,this,field);
  QualifiedFileLevelSymbol(__return_storage_ptr__,file,&local_70,(Options *)d);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedExtensionName(const FieldDescriptor* d,
                                   const Options& options) {
  GOOGLE_DCHECK(d->is_extension());
  return QualifiedFileLevelSymbol(d->file(), FieldName(d), options);
}